

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O2

PermutationMatrix<8,_8,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<8,_8,_int>_>::applyTranspositionOnTheRight
          (PermutationBase<Eigen::PermutationMatrix<8,_8,_int>_> *this,Index i,Index j)

{
  undefined4 uVar1;
  
  if (((j < 8) && (i < 8)) && (-1 < (j | i))) {
    uVar1 = *(undefined4 *)(this + i * 4);
    *(undefined4 *)(this + i * 4) = *(undefined4 *)(this + j * 4);
    *(undefined4 *)(this + j * 4) = uVar1;
    return (PermutationMatrix<8,_8,_int> *)this;
  }
  __assert_fail("i>=0 && j>=0 && i<size() && j<size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PermutationMatrix.h"
                ,0xb0,
                "Derived &Eigen::PermutationBase<Eigen::PermutationMatrix<8, 8>>::applyTranspositionOnTheRight(Index, Index) [Derived = Eigen::PermutationMatrix<8, 8>]"
               );
}

Assistant:

Derived& applyTranspositionOnTheRight(Index i, Index j)
    {
      eigen_assert(i>=0 && j>=0 && i<size() && j<size());
      std::swap(indices().coeffRef(i), indices().coeffRef(j));
      return derived();
    }